

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<true,_false,_true>::insert_edge_(DaTrie<true,_false,_true> *this,Query *query)

{
  bool bVar1;
  byte bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  size_type sVar6;
  reference pvVar7;
  Query *in_RSI;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_RDI;
  DaTrie<true,_false,_true> *unaff_retaddr;
  uint32_t child_pos;
  Query *in_stack_00000298;
  DaTrie<true,_false,_true> *in_stack_000002a0;
  uint32_t in_stack_ffffffffffffffd0;
  uint local_14;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *pvVar8;
  
  pvVar8 = in_RDI;
  uVar3 = Query::node_pos(in_RSI);
  uVar5 = (uint32_t)((ulong)pvVar8 >> 0x20);
  sVar6 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::size(in_RDI);
  if (sVar6 <= uVar3) {
    __assert_fail("query.node_pos() < bc_.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x1ef,
                  "void ddd::DaTrie<true, false, true>::insert_edge_(Query &) [WithBLM = true, WithNLM = false, Prefix = true]"
                 );
  }
  uVar3 = Query::node_pos(in_RSI);
  pvVar7 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar3);
  bVar1 = Bc::is_fixed(pvVar7);
  if (bVar1) {
    uVar3 = Query::node_pos(in_RSI);
    pvVar7 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar3);
    uVar3 = Bc::base(pvVar7);
    bVar2 = Query::label(in_RSI);
    local_14 = uVar3 ^ bVar2;
    pvVar7 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)local_14);
    bVar1 = Bc::is_fixed(pvVar7);
    if (bVar1) {
      solve_(in_stack_000002a0,in_stack_00000298);
      uVar4 = Query::node_pos(in_RSI);
      pvVar7 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar4);
      in_stack_ffffffffffffffd0 = Bc::base(pvVar7);
      bVar2 = Query::label(in_RSI);
      local_14 = in_stack_ffffffffffffffd0 ^ bVar2;
    }
    fix_(unaff_retaddr,uVar5,(vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)in_RSI);
    pvVar7 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)local_14);
    uVar5 = Query::node_pos(in_RSI);
    Bc::set_check(pvVar7,uVar5);
    Query::next((Query *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),(uint32_t)((ulong)pvVar7 >> 0x20)
               );
    return;
  }
  __assert_fail("bc_[query.node_pos()].is_fixed()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                ,0x1f0,
                "void ddd::DaTrie<true, false, true>::insert_edge_(Query &) [WithBLM = true, WithNLM = false, Prefix = true]"
               );
}

Assistant:

void insert_edge_(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());

    auto child_pos = bc_[query.node_pos()].base() ^query.label();

    if (bc_[child_pos].is_fixed()) {
      solve_(query);
      child_pos = bc_[query.node_pos()].base() ^ query.label();
    }

    fix_(child_pos, blocks_);
    bc_[child_pos].set_check(query.node_pos());

    if (WithNLM) {
      auto _child_pos = bc_[query.node_pos()].base() ^node_links_[query.node_pos()].child;
      node_links_[child_pos].sib = node_links_[_child_pos].sib;
      node_links_[_child_pos].sib = query.label();
    }
    query.next(child_pos);
  }